

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_service_interface(t_cpp_generator *this,t_service *tservice,string *style)

{
  t_function *tfunction;
  bool bVar1;
  t_service *ptVar2;
  ostream *poVar3;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar4;
  allocator local_209;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_188;
  t_function **local_180;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_178;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  allocator local_b1;
  string local_b0 [8];
  string extends;
  string client_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string service_if_name;
  string *style_local;
  t_service *tservice_local;
  t_cpp_generator *this_local;
  
  service_if_name.field_2._8_8_ = style;
  std::operator+(&local_60,&(this->super_t_oop_generator).super_t_generator.service_name_,style);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,"If");
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = std::operator==(style,"CobCl");
  if (bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&extends.field_2 + 8),
                   &(this->super_t_oop_generator).super_t_generator.service_name_,"CobClient");
    if ((this->gen_templates_ & 1U) != 0) {
      std::__cxx11::string::operator+=((string *)(extends.field_2._M_local_buf + 8),"T");
      std::__cxx11::string::operator+=((string *)local_40,"T");
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)&this->f_header_);
      poVar3 = std::operator<<(poVar3,"template <class Protocol_>");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)&this->f_header_);
    poVar3 = std::operator<<(poVar3,"class ");
    poVar3 = std::operator<<(poVar3,(string *)(extends.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3,";");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)(extends.field_2._M_local_buf + 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"",&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  ptVar2 = t_service::get_extends(tservice);
  if (ptVar2 != (t_service *)0x0) {
    ptVar2 = t_service::get_extends(tservice);
    type_name_abi_cxx11_(&local_138,this,&ptVar2->super_t_type,false,false);
    std::operator+(&local_118," : virtual public ",&local_138);
    std::operator+(&local_f8,&local_118,style);
    std::operator+(&local_d8,&local_f8,"If");
    std::__cxx11::string::operator=(local_b0,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    bVar1 = std::operator==(style,"CobCl");
    if ((bVar1) && ((this->gen_templates_ & 1U) != 0)) {
      std::__cxx11::string::operator+=(local_b0,"T<Protocol_>");
    }
  }
  bVar1 = std::operator==(style,"CobCl");
  if ((bVar1) && ((this->gen_templates_ & 1U) != 0)) {
    poVar3 = std::operator<<((ostream *)&this->f_header_,"template <class Protocol_>");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])
            (this,&this->f_header_,tservice);
  poVar3 = std::operator<<((ostream *)&this->f_header_,"class ");
  poVar3 = std::operator<<(poVar3,(string *)local_40);
  poVar3 = std::operator<<(poVar3,local_b0);
  poVar3 = std::operator<<(poVar3," {");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," public:");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_header_,
                           (string *)
                           &functions.
                            super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  poVar3 = std::operator<<(poVar3,"virtual ~");
  poVar3 = std::operator<<(poVar3,(string *)local_40);
  poVar3 = std::operator<<(poVar3,"() {}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_178);
  local_180 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_178._M_current = local_180;
  while( true ) {
    local_188._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=(&local_178,&local_188);
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_178);
    bVar1 = t_doc::has_doc(&(*pptVar4)->super_t_doc);
    if (bVar1) {
      std::operator<<((ostream *)&this->f_header_,(string *)&::endl_abi_cxx11_);
    }
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_178);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
              (this,&this->f_header_,*pptVar4);
    t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&this->f_header_,(string *)&local_1a8);
    poVar3 = std::operator<<(poVar3,"virtual ");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_178);
    tfunction = *pptVar4;
    std::__cxx11::string::string((string *)&local_1e8,(string *)style);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,"",&local_209);
    function_signature(&local_1c8,this,tfunction,&local_1e8,&local_208,true);
    poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
    poVar3 = std::operator<<(poVar3," = 0;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1a8);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_178);
  }
  t_generator::indent_down((t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_header_,"};");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  bVar1 = std::operator==(style,"CobCl");
  if ((bVar1) && ((this->gen_templates_ & 1U) != 0)) {
    poVar3 = std::operator<<((ostream *)&this->f_header_,"typedef ");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    poVar3 = std::operator<<(poVar3,"< ::apache::thrift::protocol::TProtocol> ");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.service_name_);
    poVar3 = std::operator<<(poVar3,(string *)style);
    poVar3 = std::operator<<(poVar3,"If;");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_cpp_generator::generate_service_interface(t_service* tservice, string style) {

  string service_if_name = service_name_ + style + "If";
  if (style == "CobCl") {
    // Forward declare the client.
    string client_name = service_name_ + "CobClient";
    if (gen_templates_) {
      client_name += "T";
      service_if_name += "T";
      indent(f_header_) << "template <class Protocol_>" << endl;
    }
    indent(f_header_) << "class " << client_name << ";" << endl << endl;
  }

  string extends = "";
  if (tservice->get_extends() != nullptr) {
    extends = " : virtual public " + type_name(tservice->get_extends()) + style + "If";
    if (style == "CobCl" && gen_templates_) {
      // TODO(simpkins): If gen_templates_ is enabled, we currently assume all
      // parent services were also generated with templates enabled.
      extends += "T<Protocol_>";
    }
  }

  if (style == "CobCl" && gen_templates_) {
    f_header_ << "template <class Protocol_>" << endl;
  }

  generate_java_doc(f_header_, tservice);

  f_header_ << "class " << service_if_name << extends << " {" << endl << " public:" << endl;
  indent_up();
  f_header_ << indent() << "virtual ~" << service_if_name << "() {}" << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    if ((*f_iter)->has_doc())
      f_header_ << endl;
    generate_java_doc(f_header_, *f_iter);
    f_header_ << indent() << "virtual " << function_signature(*f_iter, style) << " = 0;" << endl;
  }
  indent_down();
  f_header_ << "};" << endl << endl;

  if (style == "CobCl" && gen_templates_) {
    // generate a backwards-compatible typedef for clients that do not
    // know about the new template-style code
    f_header_ << "typedef " << service_if_name << "< ::apache::thrift::protocol::TProtocol> "
              << service_name_ << style << "If;" << endl << endl;
  }
}